

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyText
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  char *__begin2;
  int iVar4;
  ulong uVar5;
  
  if (prefix.size_ != 0) {
    sVar3 = 0;
    iVar4 = 0;
    do {
      bVar1 = prefix.ptr[sVar3];
      uVar5 = (ulong)bVar1;
      if (iVar4 == 2) {
        if (bVar1 == 0x22) {
          return PLAUSIBLE;
        }
        if (bVar1 == 0x27) {
          return PLAUSIBLE;
        }
LAB_00120081:
        if (((bVar1 != 10 && bVar1 < 0x20) && (bVar1 & 0xfb) != 9) && bVar1 != 0xb) {
          return IMPOSSIBLE;
        }
        iVar2 = iVar4;
        if (bVar1 == 0x7f) {
          return IMPOSSIBLE;
        }
      }
      else if (iVar4 == 1) {
        iVar2 = 0;
        if (bVar1 != 10) goto LAB_00120081;
      }
      else {
        if (0x28 < bVar1) {
          return IMPOSSIBLE;
        }
        if ((0x100002e00U >> (uVar5 & 0x3f) & 1) != 0) goto LAB_00120081;
        if (uVar5 == 0x23) {
          iVar2 = 1;
        }
        else {
          iVar2 = 2;
          if (uVar5 != 0x28) {
            return IMPOSSIBLE;
          }
        }
      }
      iVar4 = iVar2;
      sVar3 = sVar3 + 1;
    } while (prefix.size_ != sVar3);
  }
  return PLAUSIBLE;
}

Assistant:

Plausibility isPlausiblyText(kj::ArrayPtr<const byte> prefix) {
    enum { PREAMBLE, COMMENT, BODY } state = PREAMBLE;

    for (char c: prefix.asChars()) {
      switch (state) {
        case PREAMBLE:
          // Before opening parenthesis.
          switch (c) {
            case '(': state = BODY; continue;
            case '#': state = COMMENT; continue;
            case ' ':
            case '\n':
            case '\r':
            case '\t':
            case '\v':
              // whitespace
              break;
            default:
              // Not whitespace, not comment, not open parenthesis. Impossible!
              return IMPOSSIBLE;
          }
          break;
        case COMMENT:
          switch (c) {
            case '\n': state = PREAMBLE; continue;
            default: break;
          }
          break;
        case BODY:
          switch (c) {
            case '\"':
            case '\'':
              // String literal. Let's stop here before things get complicated.
              return PLAUSIBLE;
            default:
              break;
          }
          break;
      }

      if ((static_cast<uint8_t>(c) < 0x20 && c != '\n' && c != '\r' && c != '\t' && c != '\v')
          || c == 0x7f) {
        // Unprintable character.
        return IMPOSSIBLE;
      }
    }

    return PLAUSIBLE;
  }